

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_param(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos247;
  int yypos247;
  int yythunkpos246;
  int yypos246;
  int yythunkpos243;
  int yypos243;
  int yythunkpos242;
  int yypos242;
  int yythunkpos240;
  int yypos240;
  int yythunkpos237;
  int yypos237;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,6,0,"yyPush");
  yyDo(G,yy_1_param,G->begin,G->end,"yy_1_param");
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yy_ident(G);
  if (iVar4 != 0) {
    yyDo(G,yySet,-6,0,"yySet");
    iVar4 = yy_ws(G);
    if (iVar4 != 0) {
      do {
        iVar5 = G->pos;
        iVar3 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar3;
      goto LAB_00109bc7;
    }
  }
  G->pos = iVar5;
  G->thunkpos = iVar3;
LAB_00109bc7:
  iVar5 = yy_param_term(G);
  if (iVar5 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    yyDo(G,yySet,-5,0,"yySet");
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar5 = yy__(G);
      if (iVar5 == 0) break;
      iVar5 = G->pos;
      iVar3 = G->thunkpos;
      iVar4 = yy_param_defaults(G);
      if (iVar4 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar3;
        iVar5 = yymatchString(G,"is");
        if ((iVar5 == 0) || (iVar5 = yy_ws(G), iVar5 == 0)) break;
        do {
          iVar5 = G->pos;
          iVar3 = G->thunkpos;
          iVar4 = yy_ws(G);
        } while (iVar4 != 0);
        G->pos = iVar5;
        G->thunkpos = iVar3;
        iVar5 = G->pos;
        iVar3 = G->thunkpos;
        iVar4 = yy_is_copy(G);
        if (iVar4 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar3;
          iVar4 = yy_is_rw(G);
          if (iVar4 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar3;
            iVar5 = yy_is_ref(G);
            if (iVar5 == 0) break;
            yyDo(G,yySet,-1,0,"yySet");
          }
          else {
            yyDo(G,yySet,-2,0,"yySet");
          }
        }
        else {
          yyDo(G,yySet,-3,0,"yySet");
        }
      }
      else {
        yyDo(G,yySet,-4,0,"yySet");
      }
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyDo(G,yy_2_param,G->begin,G->end,"yy_2_param");
    yyDo(G,yyPop,6,0,"yyPop");
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_param(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 6, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "param"));
  yyDo(G, yy_1_param, G->begin, G->end, "yy_1_param");

  {  int yypos237= G->pos, yythunkpos237= G->thunkpos;  if (!yy_ident(G))  goto l237;
  yyDo(G, yySet, -6, 0, "yySet");
  if (!yy_ws(G))  goto l237;

  l239:;	
  {  int yypos240= G->pos, yythunkpos240= G->thunkpos;  if (!yy_ws(G))  goto l240;
  goto l239;
  l240:;	  G->pos= yypos240; G->thunkpos= yythunkpos240;
  }  goto l238;
  l237:;	  G->pos= yypos237; G->thunkpos= yythunkpos237;
  }
  l238:;	  if (!yy_param_term(G))  goto l236;
  yyDo(G, yySet, -5, 0, "yySet");

  l241:;	
  {  int yypos242= G->pos, yythunkpos242= G->thunkpos;  if (!yy__(G))  goto l242;

  {  int yypos243= G->pos, yythunkpos243= G->thunkpos;  if (!yy_param_defaults(G))  goto l244;
  yyDo(G, yySet, -4, 0, "yySet");
  goto l243;
  l244:;	  G->pos= yypos243; G->thunkpos= yythunkpos243;  if (!yymatchString(G, "is")) goto l242;
  if (!yy_ws(G))  goto l242;

  l245:;	
  {  int yypos246= G->pos, yythunkpos246= G->thunkpos;  if (!yy_ws(G))  goto l246;
  goto l245;
  l246:;	  G->pos= yypos246; G->thunkpos= yythunkpos246;
  }
  {  int yypos247= G->pos, yythunkpos247= G->thunkpos;  if (!yy_is_copy(G))  goto l248;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l247;
  l248:;	  G->pos= yypos247; G->thunkpos= yythunkpos247;  if (!yy_is_rw(G))  goto l249;
  yyDo(G, yySet, -2, 0, "yySet");
  goto l247;
  l249:;	  G->pos= yypos247; G->thunkpos= yythunkpos247;  if (!yy_is_ref(G))  goto l242;
  yyDo(G, yySet, -1, 0, "yySet");

  }
  l247:;	
  }
  l243:;	  goto l241;
  l242:;	  G->pos= yypos242; G->thunkpos= yythunkpos242;
  }  yyDo(G, yy_2_param, G->begin, G->end, "yy_2_param");
  yyprintf((stderr, "  ok   param"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 6, 0, "yyPop");
  return 1;
  l236:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "param"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}